

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

sexp_conflict
sexp_integer_length(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  long lVar1;
  sexp_uint_t sVar2;
  sexp_conflict psVar3;
  
  if (((ulong)x & 1) == 0) {
    if ((((ulong)x & 2) != 0) || (x->tag != 0xc)) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,x);
      return psVar3;
    }
    lVar1 = sexp_bignum_hi(x);
    sVar2 = integer_log2(*(sexp_uint_t *)((long)&x->value + lVar1 * 8 + 8));
    lVar1 = (lVar1 + -1) * 0x80 + sVar2 * 2;
  }
  else {
    sVar2 = integer_log2((long)x >> 0x3f ^ (long)x >> 1);
    lVar1 = sVar2 * 2;
  }
  return (sexp_conflict)(lVar1 + 1);
}

Assistant:

sexp sexp_integer_length (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
  sexp_sint_t tmp;
#if SEXP_USE_BIGNUMS
  sexp_sint_t hi;
#endif
  if (sexp_fixnump(x)) {
    tmp = sexp_unbox_fixnum(x);
    return sexp_make_fixnum(integer_log2(tmp < 0 ? -tmp-1 : tmp));
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    hi = sexp_bignum_hi(x);
    return sexp_make_fixnum(integer_log2(sexp_bignum_data(x)[hi-1])
                            + (hi-1)*sizeof(sexp_uint_t)*CHAR_BIT);
#endif
  } else {
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
}